

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryFlatLoop<duckdb::MinMaxState<float>,float,duckdb::MaxOperation>
               (float *idata,AggregateInputData *aggr_input_data,MinMaxState<float> **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  MinMaxState<float> *pMVar3;
  MinMaxState<float> **ppMVar4;
  ulong uVar5;
  bool bVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  float local_6c;
  float local_68;
  float local_64;
  MinMaxState<float> **local_60;
  idx_t local_58;
  ulong local_50;
  float *local_48;
  ValidityMask *local_40;
  float *local_38;
  
  local_60 = states;
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar11 = 0;
      do {
        pMVar3 = local_60[iVar11];
        local_64 = idata[iVar11];
        if (pMVar3->isset == false) {
          pMVar3->value = local_64;
          pMVar3->isset = true;
        }
        else {
          bVar6 = GreaterThan::Operation<float>(&local_64,&pMVar3->value);
          if (bVar6) {
            pMVar3->value = local_64;
          }
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    uVar8 = 0;
    uVar10 = 0;
    local_58 = count;
    local_48 = idata;
    do {
      ppMVar4 = local_60;
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
LAB_012a843b:
        uVar5 = uVar10;
        if (uVar10 < uVar12) {
          do {
            pMVar3 = ppMVar4[uVar10];
            if (pMVar3->isset == false) {
              pMVar3->value = idata[uVar10];
              pMVar3->isset = true;
            }
            else {
              local_6c = idata[uVar10];
              bVar6 = GreaterThan::Operation<float>(&local_6c,&pMVar3->value);
              if (bVar6) {
                pMVar3->value = local_6c;
              }
            }
            uVar10 = uVar10 + 1;
            uVar5 = uVar12;
          } while (uVar12 != uVar10);
        }
      }
      else {
        uVar2 = puVar1[uVar8];
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_012a843b;
        uVar5 = uVar12;
        if ((uVar2 != 0) && (uVar5 = uVar10, count = local_58, uVar10 < uVar12)) {
          pfVar7 = idata + uVar10;
          uVar9 = 0;
          local_38 = pfVar7;
          do {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              pMVar3 = ppMVar4[uVar10 + uVar9];
              if (pMVar3->isset == false) {
                pMVar3->value = pfVar7[uVar9];
                pMVar3->isset = true;
              }
              else {
                local_68 = pfVar7[uVar9];
                bVar6 = GreaterThan::Operation<float>(&local_68,&pMVar3->value);
                pfVar7 = local_38;
                idata = local_48;
                if (bVar6) {
                  pMVar3->value = local_68;
                }
              }
            }
            uVar9 = uVar9 + 1;
            uVar5 = uVar12;
            count = local_58;
          } while (uVar12 - uVar10 != uVar9);
        }
      }
      uVar10 = uVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_50);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}